

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epoll.cc
# Opt level: O1

void __thiscall tt::net::Epoll::epoll_mod(Epoll *this,SP_Channel *request,int timeout)

{
  __uint32_t _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  int iVar3;
  undefined1 local_3c [8];
  epoll_event event;
  
  if (0 < timeout) {
    event.data = (epoll_data_t)
                 (request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    add_timer(this,(SP_Channel *)&event.data,timeout);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  local_3c._4_4_ =
       Channel::getFd((request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  peVar2 = (request->super___shared_ptr<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_3c._0_4_ = peVar2->m_events;
  _Var1 = peVar2->m_lastEvents;
  peVar2->m_lastEvents = local_3c._0_4_;
  if (_Var1 != local_3c._0_4_) {
    iVar3 = epoll_ctl(this->m_epollFd,3,local_3c._4_4_,(epoll_event *)local_3c);
    if (iVar3 < 0) {
      epoll_mod();
    }
  }
  return;
}

Assistant:

void Epoll::epoll_mod(SP_Channel request, int timeout){
	
	if(timeout > 0) add_timer(request,timeout);

	int fd = request->getFd();
	if(!request->EqualAndUpdateLastEvents()){
		struct epoll_event event;

		event.data.fd = fd;
		event.events = request->getEvents();
		if(epoll_ctl(m_epollFd, EPOLL_CTL_MOD, fd, &event) < 0){
			perror("epoll_mod error");

			m_fd2chan[fd].reset();
		}
	
	}
}